

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall
tinyxml2::XMLPrinter::VisitEnter(XMLPrinter *this,XMLElement *element,XMLAttribute *attribute)

{
  undefined1 uVar1;
  int iVar2;
  XMLNode *pXVar3;
  undefined4 extraout_var;
  char *value;
  XMLAttribute *in_RDX;
  XMLNode *in_RSI;
  XMLPrinter *in_RDI;
  bool compactMode;
  XMLElement *parentElem;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 compactMode_00;
  undefined7 in_stack_ffffffffffffffc8;
  long local_20;
  XMLAttribute *local_18;
  
  compactMode_00 = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  local_20 = 0;
  pXVar3 = XMLNode::Parent(in_RSI);
  if (pXVar3 != (XMLNode *)0x0) {
    pXVar3 = XMLNode::Parent(in_RSI);
    iVar2 = (*pXVar3->_vptr_XMLNode[6])();
    local_20 = CONCAT44(extraout_var,iVar2);
  }
  if (local_20 == 0) {
    uVar1 = in_RDI->_compactMode;
  }
  else {
    iVar2 = (*(in_RDI->super_XMLVisitor)._vptr_XMLVisitor[0xb])(in_RDI,local_20);
    uVar1 = (undefined1)iVar2;
  }
  XMLElement::Name((XMLElement *)0x2a670f);
  OpenElement(in_RDI,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffc8),(bool)compactMode_00);
  for (local_18 = in_RDX; local_18 != (XMLAttribute *)0x0; local_18 = XMLAttribute::Next(local_18))
  {
    value = XMLAttribute::Name((XMLAttribute *)0x2a6737);
    XMLAttribute::Value((XMLAttribute *)0x2a6746);
    PushAttribute(in_RDI,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffc8),value);
  }
  return true;
}

Assistant:

bool XMLPrinter::VisitEnter( const XMLElement& element, const XMLAttribute* attribute )
{
    const XMLElement* parentElem = 0;
    if ( element.Parent() ) {
        parentElem = element.Parent()->ToElement();
    }
    const bool compactMode = parentElem ? CompactMode( *parentElem ) : _compactMode;
    OpenElement( element.Name(), compactMode );
    while ( attribute ) {
        PushAttribute( attribute->Name(), attribute->Value() );
        attribute = attribute->Next();
    }
    return true;
}